

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadCodeSection(BinaryReader *this,Offset section_size)

{
  Index *pIVar1;
  Type type;
  bool bVar2;
  int iVar3;
  Result RVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  Offset OVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint32_t body_size;
  Index num_local_decls;
  Type local_type;
  uint local_54;
  uint local_50;
  uint local_4c;
  Index *local_48;
  Offset local_40;
  Type local_38;
  
  iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x32])();
  if (iVar3 == 0) {
    pIVar1 = &this->num_function_bodies_;
    RVar4 = ReadCount(this,pIVar1,"function body count");
    if (RVar4.enum_ != Error) {
      if (this->num_function_signatures_ == this->num_function_bodies_) {
        iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x33])();
        if (iVar3 == 0) {
          if (*pIVar1 != 0) {
            uVar5 = 0;
            local_48 = pIVar1;
            do {
              uVar10 = this->num_func_imports_ + uVar5;
              RVar4 = ReadU32Leb128(this,&local_54,"function body size");
              if (RVar4.enum_ == Error) {
                return (Result)Error;
              }
              OVar8 = (this->state_).offset + (ulong)local_54;
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x34])
                                (this->delegate_,(ulong)uVar10);
              if (iVar3 != 0) {
                pcVar6 = "BeginFunctionBody callback failed";
                goto LAB_00126597;
              }
              local_50 = uVar10;
              RVar4 = ReadCount(this,&local_4c,"local declaration count");
              uVar10 = local_4c;
              if (RVar4.enum_ == Error) {
                return (Result)Error;
              }
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x35])
                                (this->delegate_,(ulong)local_4c);
              if (iVar3 != 0) {
                pcVar6 = "OnLocalDeclCount callback failed";
                goto LAB_00126597;
              }
              local_40 = OVar8;
              if (uVar10 != 0) {
                uVar12 = 0;
                uVar9 = 0;
                do {
                  RVar4 = ReadU32Leb128(this,(uint32_t *)&local_38,"local type count");
                  if (RVar4.enum_ == Error) {
                    return (Result)Error;
                  }
                  uVar11 = (ulong)(uint)local_38.enum_;
                  uVar12 = uVar12 + uVar11;
                  if (uVar12 >> 0x20 != 0) {
                    PrintError(this,"local count must be <= 0x%x",0xffffffff);
                    return (Result)Error;
                  }
                  RVar4 = ReadType(this,&local_38,"local type");
                  if (RVar4.enum_ == Error) {
                    return (Result)Error;
                  }
                  type.type_index_ = local_38.type_index_;
                  type.enum_ = local_38.enum_;
                  bVar2 = IsConcreteType((BinaryReader *)this->options_,type);
                  if (!bVar2) {
                    pcVar6 = "expected valid local type";
                    goto LAB_00126597;
                  }
                  iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x36])
                                    (this->delegate_,uVar9,uVar11,type);
                  if (iVar3 != 0) {
                    pcVar6 = "OnLocalDecl callback failed";
                    goto LAB_00126597;
                  }
                  uVar7 = (int)uVar9 + 1;
                  uVar9 = (ulong)uVar7;
                } while (uVar10 != uVar7);
              }
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x37])();
              if (iVar3 != 0) {
                pcVar6 = "EndLocalDecls callback failed";
                goto LAB_00126597;
              }
              if (this->options_->skip_function_bodies == true) {
                (this->state_).offset = local_40;
              }
              else {
                RVar4 = ReadFunctionBody(this,local_40);
                if (RVar4.enum_ == Error) {
                  return (Result)Error;
                }
              }
              pIVar1 = local_48;
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x89])
                                (this->delegate_,(ulong)local_50);
              if (iVar3 != 0) {
                pcVar6 = "EndFunctionBody callback failed";
                goto LAB_00126597;
              }
              uVar5 = uVar5 + 1;
            } while (uVar5 < *pIVar1);
          }
          iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8a])();
          if (iVar3 == 0) {
            return (Result)Ok;
          }
          pcVar6 = "EndCodeSection callback failed";
        }
        else {
          pcVar6 = "OnFunctionBodyCount callback failed";
        }
      }
      else {
        pcVar6 = "function signature count != function body count";
      }
      PrintError(this,pcVar6);
    }
  }
  else {
    pcVar6 = "BeginCodeSection callback failed";
LAB_00126597:
    PrintError(this,pcVar6);
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadCodeSection(Offset section_size) {
  CALLBACK(BeginCodeSection, section_size);
  CHECK_RESULT(ReadCount(&num_function_bodies_, "function body count"));
  ERROR_UNLESS(num_function_signatures_ == num_function_bodies_,
               "function signature count != function body count");
  CALLBACK(OnFunctionBodyCount, num_function_bodies_);
  for (Index i = 0; i < num_function_bodies_; ++i) {
    Index func_index = num_func_imports_ + i;
    Offset func_offset = state_.offset;
    state_.offset = func_offset;
    uint32_t body_size;
    CHECK_RESULT(ReadU32Leb128(&body_size, "function body size"));
    Offset body_start_offset = state_.offset;
    Offset end_offset = body_start_offset + body_size;
    CALLBACK(BeginFunctionBody, func_index, body_size);

    uint64_t total_locals = 0;
    Index num_local_decls;
    CHECK_RESULT(ReadCount(&num_local_decls, "local declaration count"));
    CALLBACK(OnLocalDeclCount, num_local_decls);
    for (Index k = 0; k < num_local_decls; ++k) {
      Index num_local_types;
      CHECK_RESULT(ReadIndex(&num_local_types, "local type count"));
      total_locals += num_local_types;
      ERROR_UNLESS(total_locals <= UINT32_MAX, "local count must be <= 0x%x",
                   UINT32_MAX);
      Type local_type;
      CHECK_RESULT(ReadType(&local_type, "local type"));
      ERROR_UNLESS(IsConcreteType(local_type), "expected valid local type");
      CALLBACK(OnLocalDecl, k, num_local_types, local_type);
    }
    CALLBACK(EndLocalDecls);

    if (options_.skip_function_bodies) {
      state_.offset = end_offset;
    } else {
      CHECK_RESULT(ReadFunctionBody(end_offset));
    }

    CALLBACK(EndFunctionBody, func_index);
  }
  CALLBACK0(EndCodeSection);
  return Result::Ok;
}